

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmcCexDepth.c
# Opt level: O1

Gia_Man_t * Bmc_CexTargetEnlarge(Gia_Man_t *p,int nFrames)

{
  int iVar1;
  int iVar2;
  char *pcVar3;
  Gia_Man_t *p_00;
  size_t sVar4;
  char *pcVar5;
  Vec_Int_t *pVVar6;
  Gia_Obj_t *pGVar7;
  Gia_Obj_t *pGVar8;
  Gia_Man_t *pGVar9;
  ulong uVar10;
  uint uVar11;
  long lVar12;
  uint uVar13;
  int iVar14;
  ulong uVar15;
  long lVar16;
  int iVar17;
  int iVar18;
  Gia_Obj_t *pGVar19;
  int iVar20;
  bool bVar21;
  int local_38;
  int local_34;
  
  p_00 = Gia_ManStart(p->nObjs);
  pcVar3 = p->pName;
  if (pcVar3 == (char *)0x0) {
    pcVar5 = (char *)0x0;
  }
  else {
    sVar4 = strlen(pcVar3);
    pcVar5 = (char *)malloc(sVar4 + 1);
    strcpy(pcVar5,pcVar3);
  }
  p_00->pName = pcVar5;
  pcVar3 = p->pSpec;
  if (pcVar3 == (char *)0x0) {
    pcVar5 = (char *)0x0;
  }
  else {
    sVar4 = strlen(pcVar3);
    pcVar5 = (char *)malloc(sVar4 + 1);
    strcpy(pcVar5,pcVar3);
  }
  p_00->pSpec = pcVar5;
  Gia_ManHashAlloc(p_00);
  p->pObjs->Value = 0;
  if (0 < nFrames) {
    iVar18 = 0;
    do {
      pVVar6 = p->vCis;
      uVar10 = (ulong)(uint)pVVar6->nSize;
      if (p->nRegs < pVVar6->nSize) {
        lVar12 = 0;
        do {
          if ((int)uVar10 <= lVar12) goto LAB_004fd0e2;
          if ((pVVar6->pArray[lVar12] < 0) || (p->nObjs <= pVVar6->pArray[lVar12]))
          goto LAB_004fd0c3;
          if (p->pObjs == (Gia_Obj_t *)0x0) break;
          pGVar7 = Gia_ManAppendObj(p_00);
          uVar10 = *(ulong *)pGVar7;
          *(ulong *)pGVar7 = uVar10 | 0x9fffffff;
          *(ulong *)pGVar7 =
               uVar10 & 0xe0000000ffffffff | 0x9fffffff |
               (ulong)(p_00->vCis->nSize & 0x1fffffff) << 0x20;
          pGVar19 = p_00->pObjs;
          if ((pGVar7 < pGVar19) || (pGVar19 + p_00->nObjs <= pGVar7)) goto LAB_004fd101;
          Vec_IntPush(p_00->vCis,(int)((ulong)((long)pGVar7 - (long)pGVar19) >> 2) * -0x55555555);
          if ((pGVar7 < p_00->pObjs) || (p_00->pObjs + p_00->nObjs <= pGVar7)) goto LAB_004fd101;
          lVar12 = lVar12 + 1;
          pVVar6 = p->vCis;
          uVar10 = (ulong)pVVar6->nSize;
        } while (lVar12 < (long)(uVar10 - (long)p->nRegs));
      }
      iVar18 = iVar18 + 1;
    } while (iVar18 != nFrames);
  }
  iVar18 = p->nRegs;
  if (0 < iVar18) {
    iVar20 = 0;
    do {
      iVar14 = p->vCis->nSize;
      uVar11 = (iVar14 - iVar18) + iVar20;
      if (((int)uVar11 < 0) || (iVar14 <= (int)uVar11)) goto LAB_004fd0e2;
      iVar18 = p->vCis->pArray[uVar11];
      if (((long)iVar18 < 0) || (p->nObjs <= iVar18)) goto LAB_004fd0c3;
      pGVar19 = p->pObjs;
      if (pGVar19 == (Gia_Obj_t *)0x0) break;
      pGVar8 = Gia_ManAppendObj(p_00);
      uVar10 = *(ulong *)pGVar8;
      *(ulong *)pGVar8 = uVar10 | 0x9fffffff;
      *(ulong *)pGVar8 =
           uVar10 & 0xe0000000ffffffff | 0x9fffffff |
           (ulong)(p_00->vCis->nSize & 0x1fffffff) << 0x20;
      pGVar7 = p_00->pObjs;
      if ((pGVar8 < pGVar7) || (pGVar7 + p_00->nObjs <= pGVar8)) {
LAB_004fd101:
        __assert_fail("p->pObjs <= pObj && pObj < p->pObjs + p->nObjs",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/gia.h"
                      ,0x1ab,"int Gia_ObjId(Gia_Man_t *, Gia_Obj_t *)");
      }
      Vec_IntPush(p_00->vCis,(int)((ulong)((long)pGVar8 - (long)pGVar7) >> 2) * -0x55555555);
      pGVar7 = p_00->pObjs;
      if ((pGVar8 < pGVar7) || (pGVar7 + p_00->nObjs <= pGVar8)) goto LAB_004fd101;
      pGVar19[iVar18].Value = (int)((ulong)((long)pGVar8 - (long)pGVar7) >> 2) * 0x55555556;
      iVar20 = iVar20 + 1;
      iVar18 = p->nRegs;
    } while (iVar20 < iVar18);
  }
  if (0 < nFrames) {
    local_38 = nFrames + -1;
    iVar18 = 0;
    local_34 = nFrames;
    do {
      local_34 = local_34 + -1;
      pVVar6 = p->vCis;
      uVar11 = pVVar6->nSize;
      uVar13 = uVar11 - p->nRegs;
      if (uVar13 != 0 && p->nRegs <= (int)uVar11) {
        uVar10 = (ulong)uVar11;
        if ((int)uVar11 < 1) {
          uVar10 = 0;
        }
        lVar12 = (long)(int)(uVar13 * local_38);
        uVar15 = 0;
        do {
          bVar21 = uVar10 == 0;
          uVar10 = uVar10 - 1;
          if (bVar21) goto LAB_004fd0e2;
          iVar20 = pVVar6->pArray[uVar15];
          if (((long)iVar20 < 0) || (p->nObjs <= iVar20)) goto LAB_004fd0c3;
          if (p->pObjs == (Gia_Obj_t *)0x0) break;
          if (((int)(local_34 * uVar13) < 0) || (p_00->vCis->nSize <= lVar12)) goto LAB_004fd0e2;
          iVar14 = p_00->vCis->pArray[lVar12];
          if (((long)iVar14 < 0) || (p_00->nObjs <= iVar14)) goto LAB_004fd0c3;
          pGVar19 = p_00->pObjs;
          pGVar7 = (Gia_Obj_t *)((ulong)(pGVar19 + iVar14) & 0xfffffffffffffffe);
          if ((pGVar7 < pGVar19) || (pGVar19 + p_00->nObjs <= pGVar7)) goto LAB_004fd101;
          iVar17 = (int)((ulong)((long)pGVar7 - (long)pGVar19) >> 2);
          if (iVar17 * -0x55555555 < 0) {
            __assert_fail("Var >= 0 && !(c >> 1)",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/util/abc_global.h"
                          ,0x10b,"int Abc_Var2Lit(int, int)");
          }
          p->pObjs[iVar20].Value = ((uint)(pGVar19 + iVar14) & 1) + iVar17 * 0x55555556;
          uVar15 = uVar15 + 1;
          lVar12 = lVar12 + 1;
        } while (uVar13 != uVar15);
      }
      iVar20 = p->nObjs;
      if ((0 < iVar20) && (pGVar19 = p->pObjs, pGVar19 != (Gia_Obj_t *)0x0)) {
        lVar12 = 0;
        do {
          uVar10 = *(ulong *)pGVar19;
          if ((uVar10 & 0x1fffffff) != 0x1fffffff && -1 < (int)uVar10) {
            if (((int)pGVar19[-(uVar10 & 0x1fffffff)].Value < 0) ||
               (uVar11 = (uint)(uVar10 >> 0x20),
               (int)pGVar19[-(ulong)(uVar11 & 0x1fffffff)].Value < 0)) goto LAB_004fd120;
            uVar11 = Gia_ManHashAnd(p_00,pGVar19[-(uVar10 & 0x1fffffff)].Value ^
                                         (uint)(uVar10 >> 0x1d) & 1,
                                    pGVar19[-(ulong)(uVar11 & 0x1fffffff)].Value ^
                                    uVar11 >> 0x1d & 1);
            pGVar19->Value = uVar11;
          }
          lVar12 = lVar12 + 1;
          iVar20 = p->nObjs;
        } while ((lVar12 < iVar20) && (pGVar19 = p->pObjs + lVar12, p->pObjs != (Gia_Obj_t *)0x0));
      }
      iVar14 = p->nRegs;
      lVar12 = (long)iVar14;
      if (0 < lVar12) {
        pVVar6 = p->vCos;
        iVar17 = pVVar6->nSize;
        uVar10 = (ulong)(uint)(iVar17 - iVar14);
        lVar16 = lVar12;
        do {
          if (((int)uVar10 < 0) || (iVar17 <= (int)uVar10)) goto LAB_004fd0e2;
          iVar1 = pVVar6->pArray[uVar10];
          if (((long)iVar1 < 0) || (iVar20 <= iVar1)) goto LAB_004fd0c3;
          if (p->pObjs == (Gia_Obj_t *)0x0) break;
          pGVar19 = p->pObjs + iVar1;
          if ((int)pGVar19[-(ulong)((uint)*(undefined8 *)pGVar19 & 0x1fffffff)].Value < 0)
          goto LAB_004fd120;
          pGVar19->Value =
               (uint)*(undefined8 *)pGVar19 >> 0x1d & 1 ^
               pGVar19[-(ulong)((uint)*(undefined8 *)pGVar19 & 0x1fffffff)].Value;
          uVar10 = uVar10 + 1;
          lVar16 = lVar16 + -1;
        } while (lVar16 != 0);
      }
      if (0 < iVar14) {
        pVVar6 = p->vCos;
        iVar17 = pVVar6->nSize;
        uVar10 = (ulong)(uint)(iVar17 - iVar14);
        iVar14 = -iVar14;
        do {
          if ((iVar17 + iVar14 < 0) || (iVar17 <= iVar17 + iVar14)) goto LAB_004fd0e2;
          iVar1 = pVVar6->pArray[uVar10];
          if (((long)iVar1 < 0) || (iVar20 <= iVar1)) goto LAB_004fd0c3;
          pGVar19 = p->pObjs;
          if (pGVar19 == (Gia_Obj_t *)0x0) break;
          iVar2 = p->vCis->nSize;
          uVar11 = iVar14 + iVar2;
          if (((int)uVar11 < 0) || (iVar2 <= (int)uVar11)) goto LAB_004fd0e2;
          iVar2 = p->vCis->pArray[uVar11];
          if (((long)iVar2 < 0) || (iVar20 <= iVar2)) goto LAB_004fd0c3;
          pGVar19[iVar2].Value = pGVar19[iVar1].Value;
          iVar14 = iVar14 + 1;
          uVar10 = uVar10 + 1;
          lVar12 = lVar12 + -1;
        } while (lVar12 != 0);
      }
      iVar18 = iVar18 + 1;
      local_38 = local_38 + -1;
    } while (iVar18 != nFrames);
  }
  iVar18 = p->vCos->nSize;
  if (iVar18 <= p->nRegs) {
    __assert_fail("v < Gia_ManPoNum(p)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/gia.h"
                  ,0x1a7,"Gia_Obj_t *Gia_ManPo(Gia_Man_t *, int)");
  }
  if (0 < iVar18) {
    iVar18 = *p->vCos->pArray;
    if ((-1 < (long)iVar18) && (iVar18 < p->nObjs)) {
      pGVar19 = p->pObjs + iVar18;
      if (-1 < (int)pGVar19[-(ulong)((uint)*(undefined8 *)pGVar19 & 0x1fffffff)].Value) {
        uVar11 = Gia_ManAppendCo(p_00,(uint)*(undefined8 *)pGVar19 >> 0x1d & 1 ^
                                      pGVar19[-(ulong)((uint)*(undefined8 *)pGVar19 & 0x1fffffff)].
                                      Value);
        pGVar19->Value = uVar11;
        Gia_ManHashStop(p_00);
        pGVar9 = Gia_ManCleanup(p_00);
        Gia_ManStop(p_00);
        return pGVar9;
      }
LAB_004fd120:
      __assert_fail("Lit >= 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/util/abc_global.h"
                    ,0x10f,"int Abc_LitNotCond(int, int)");
    }
LAB_004fd0c3:
    __assert_fail("v >= 0 && v < p->nObjs",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/gia/gia.h"
                  ,0x1a3,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
  }
LAB_004fd0e2:
  __assert_fail("i >= 0 && i < p->nSize",
                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecInt.h"
                ,0x19e,"int Vec_IntEntry(Vec_Int_t *, int)");
}

Assistant:

Gia_Man_t * Bmc_CexTargetEnlarge( Gia_Man_t * p, int nFrames )
{
    Gia_Man_t * pNew, * pOne;
    Gia_Obj_t * pObj, * pObjRo;
    int i, k;
    pNew = Gia_ManStart( Gia_ManObjNum(p) );
    pNew->pName = Abc_UtilStrsav( p->pName );
    pNew->pSpec = Abc_UtilStrsav( p->pSpec );
    Gia_ManHashAlloc( pNew );
    Gia_ManConst0(p)->Value = 0;
    for ( k = 0; k < nFrames; k++ )
        Gia_ManForEachPi( p, pObj, i )
            Gia_ManAppendCi( pNew );
    Gia_ManForEachRo( p, pObj, i )
        pObj->Value = Gia_ManAppendCi( pNew );
    for ( k = 0; k < nFrames; k++ )
    {
        Gia_ManForEachPi( p, pObj, i )
            pObj->Value = Gia_ManCiLit( pNew, (nFrames - 1 - k) * Gia_ManPiNum(p) + i );
        Gia_ManForEachAnd( p, pObj, i )
            pObj->Value = Gia_ManHashAnd( pNew, Gia_ObjFanin0Copy(pObj), Gia_ObjFanin1Copy(pObj) );
        Gia_ManForEachRi( p, pObj, i )
            pObj->Value = Gia_ObjFanin0Copy(pObj);
        Gia_ManForEachRiRo( p, pObj, pObjRo, i )
            pObjRo->Value  = pObj->Value;
    }
    pObj = Gia_ManPo( p, 0 );
    pObj->Value = Gia_ManAppendCo( pNew, Gia_ObjFanin0Copy(pObj) );
    Gia_ManHashStop( pNew );
    pNew = Gia_ManCleanup( pOne = pNew );
    Gia_ManStop( pOne );
    return pNew;
}